

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O0

Gia_Man_t * Acec_CommonStart(Gia_Man_t *pBase,Gia_Man_t *pAdd)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  char *pcVar5;
  bool bVar6;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pAdd_local;
  Gia_Man_t *pBase_local;
  
  Gia_ManFillValue(pAdd);
  pGVar4 = Gia_ManConst0(pAdd);
  pGVar4->Value = 0;
  if (pBase == (Gia_Man_t *)0x0) {
    iVar1 = Gia_ManObjNum(pAdd);
    pAdd_local = Gia_ManStart(iVar1);
    pcVar5 = Abc_UtilStrsav(pAdd->pName);
    pAdd_local->pName = pcVar5;
    pcVar5 = Abc_UtilStrsav(pAdd->pSpec);
    pAdd_local->pSpec = pcVar5;
    local_24 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(pAdd->vCis);
      bVar6 = false;
      if (local_24 < iVar1) {
        pGStack_20 = Gia_ManCi(pAdd,local_24);
        bVar6 = pGStack_20 != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      uVar3 = Gia_ManAppendCi(pAdd_local);
      pGStack_20->Value = uVar3;
      local_24 = local_24 + 1;
    }
    Gia_ManHashAlloc(pAdd_local);
  }
  else {
    iVar1 = Gia_ManCiNum(pBase);
    iVar2 = Gia_ManCiNum(pAdd);
    if (iVar1 != iVar2) {
      __assert_fail("Gia_ManCiNum(pBase) == Gia_ManCiNum(pAdd)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                    ,0xa5,"Gia_Man_t *Acec_CommonStart(Gia_Man_t *, Gia_Man_t *)");
    }
    local_24 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(pAdd->vCis);
      bVar6 = false;
      if (local_24 < iVar1) {
        pGStack_20 = Gia_ManCi(pAdd,local_24);
        bVar6 = pGStack_20 != (Gia_Obj_t *)0x0;
      }
      pAdd_local = pBase;
      if (!bVar6) break;
      pGVar4 = Gia_ManCi(pBase,local_24);
      uVar3 = Gia_Obj2Lit(pBase,pGVar4);
      pGStack_20->Value = uVar3;
      local_24 = local_24 + 1;
    }
  }
  local_24 = 0;
  while( true ) {
    bVar6 = false;
    if (local_24 < pAdd->nObjs) {
      pGStack_20 = Gia_ManObj(pAdd,local_24);
      bVar6 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjIsAnd(pGStack_20);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(pGStack_20);
      iVar2 = Gia_ObjFanin1Copy(pGStack_20);
      uVar3 = Gia_ManHashAnd(pAdd_local,iVar1,iVar2);
      pGStack_20->Value = uVar3;
    }
    local_24 = local_24 + 1;
  }
  return pAdd_local;
}

Assistant:

Gia_Man_t * Acec_CommonStart( Gia_Man_t * pBase, Gia_Man_t * pAdd )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( pAdd );
    Gia_ManConst0(pAdd)->Value = 0;
    if ( pBase == NULL )
    {
        pBase = Gia_ManStart( Gia_ManObjNum(pAdd) );
        pBase->pName = Abc_UtilStrsav( pAdd->pName );
        pBase->pSpec = Abc_UtilStrsav( pAdd->pSpec );
        Gia_ManForEachCi( pAdd, pObj, i )
            pObj->Value = Gia_ManAppendCi(pBase);
        Gia_ManHashAlloc( pBase );
    }
    else
    {
        assert( Gia_ManCiNum(pBase) == Gia_ManCiNum(pAdd) );
        Gia_ManForEachCi( pAdd, pObj, i )
            pObj->Value = Gia_Obj2Lit( pBase, Gia_ManCi(pBase, i) );
    }
    Gia_ManForEachAnd( pAdd, pObj, i )
        pObj->Value = Gia_ManHashAnd( pBase, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    return pBase;
}